

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Decompose_LDLt(TPZSkylMatrix<std::complex<double>_> *this)

{
  char cVar1;
  undefined8 *puVar2;
  complex<double> **ppcVar3;
  undefined8 uVar4;
  undefined *puVar5;
  int iVar6;
  int extraout_var;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  complex<double> *__y;
  undefined1 *puVar12;
  complex<double> *__z;
  complex<double> *pcVar13;
  long lVar14;
  ostream *poVar15;
  long lVar16;
  long lVar17;
  complex<double> *pcVar18;
  ostream *this_00;
  complex<double> *pcVar19;
  undefined1 *puVar20;
  bool bVar21;
  double extraout_XMM0_Qa;
  double dVar22;
  double dVar23;
  double dVar24;
  complex<double> a;
  long local_e0;
  complex<double> *local_d0;
  undefined1 local_88 [16];
  ostream local_78 [8];
  double local_70;
  TPZVec<std::complex<double>_> diag;
  long size;
  
  cVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 1;
    }
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Decompose_LDLt() [TVar = std::complex<double>]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  iVar6 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  size = CONCAT44(extraout_var,iVar6);
  TPZVec<std::complex<double>_>::TPZVec(&diag,size);
  lVar7 = 0;
  lVar9 = 0;
  if (size != 0 && -1 < extraout_var) {
    lVar9 = size;
  }
  while (bVar21 = lVar9 != 0, lVar9 = lVar9 + -1, bVar21) {
    puVar2 = *(undefined8 **)((long)(this->fElem).fStore + lVar7);
    uVar4 = puVar2[1];
    *(undefined8 *)((diag.fStore)->_M_value + lVar7 * 2) = *puVar2;
    *(undefined8 *)((long)((diag.fStore)->_M_value + lVar7 * 2) + 8) = uVar4;
    lVar7 = lVar7 + 8;
  }
  lVar7 = 2;
  lVar14 = 3;
  poVar15 = (ostream *)0x20;
  local_e0 = 0x10;
  for (lVar9 = 1; lVar9 < size; lVar9 = lVar9 + 1) {
    ppcVar3 = (this->fElem).fStore;
    lVar10 = (long)ppcVar3[lVar9 + 1] - (long)ppcVar3[lVar9];
    lVar16 = (long)poVar15 - lVar10;
    lVar10 = lVar10 >> 4;
    pcVar19 = (complex<double> *)((lVar9 - lVar10) + 1);
    lVar11 = lVar7 - lVar10;
    __z = (complex<double> *)(lVar14 - lVar10);
    poVar8 = poVar15;
    pcVar13 = pcVar19;
    local_d0 = __z;
    while ((long)pcVar13 <= lVar9) {
      ppcVar3 = (this->fElem).fStore;
      lVar10 = (long)ppcVar3[(long)(pcVar13->_M_value + 1)] - (long)ppcVar3[(long)pcVar13] >> 4;
      puVar5 = pcVar13->_M_value;
      pcVar18 = (complex<double> *)((long)(puVar5 + 1) - lVar10);
      if ((long)pcVar18 < (long)pcVar19) {
        pcVar18 = pcVar19;
      }
      __y = diag.fStore + (long)pcVar18;
      puVar12 = ppcVar3[(long)pcVar13]->_M_value + lVar16;
      puVar20 = ppcVar3[lVar9]->_M_value + local_e0;
      lVar10 = (long)local_d0 - lVar10;
      lVar17 = lVar10;
      if (lVar10 < lVar11) {
        lVar17 = lVar11;
      }
      lVar17 = lVar17 * -0x10;
      dVar22 = 0.0;
      dVar24 = 0.0;
      for (; (long)pcVar18 < (long)pcVar13; pcVar18 = (complex<double> *)(pcVar18->_M_value + 1)) {
        local_88._0_8_ = *(undefined8 *)(puVar12 + lVar17);
        dVar23 = -*(double *)(puVar12 + lVar17 + 8);
        local_88._8_8_ = dVar23;
        std::operator*((complex<double> *)(puVar20 + lVar17),(complex<double> *)local_88);
        poVar8 = local_78;
        __z = __y;
        local_70 = dVar23;
        std::operator*((complex<double> *)poVar8,__y);
        __y = __y + 1;
        dVar22 = dVar22 + extraout_XMM0_Qa;
        dVar24 = dVar24 + dVar23;
        puVar12 = puVar12 + -0x10;
        puVar20 = puVar20 + -0x10;
      }
      if (lVar10 < lVar11) {
        lVar10 = lVar11;
      }
      this_00 = (ostream *)(puVar20 + lVar10 * -0x10);
      *(double *)this_00 = *(double *)this_00 - dVar22;
      *(double *)((complex *)this_00 + 8) = *(double *)((complex *)this_00 + 8) - dVar24;
      if (puVar20 == puVar12) {
        a._M_value._8_8_ = __z;
        a._M_value._0_8_ = poVar8;
        bVar21 = IsZero(a);
        uVar4 = *(undefined8 *)((complex *)this_00 + 8);
        *(undefined8 *)__y->_M_value = *(undefined8 *)this_00;
        *(undefined8 *)(__y->_M_value + 8) = uVar4;
        if (bVar21) {
          poVar8 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix pivot = ");
          poVar8 = std::operator<<(poVar8,(complex *)this_00);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::DecomposeLDLt zero pivot\n");
          poVar8 = std::operator<<((ostream *)&std::cout,"j = ");
          poVar8 = std::ostream::_M_insert<long>((long)poVar8);
          poVar8 = std::operator<<(poVar8," l = ");
          poVar8 = std::ostream::_M_insert<long>((long)poVar8);
          std::endl<char,std::char_traits<char>>(poVar8);
          __z = pcVar13;
        }
      }
      else {
        __z = (complex<double> *)(puVar12 + lVar10 * -0x10);
        std::complex<double>::operator/=((complex<double> *)this_00,__z);
        poVar8 = this_00;
      }
      local_d0 = (complex<double> *)(local_d0->_M_value + 1);
      lVar16 = lVar16 + 0x10;
      pcVar13 = (complex<double> *)(puVar5 + 1);
    }
    lVar7 = lVar7 + 1;
    lVar14 = lVar14 + 1;
    poVar15 = poVar15 + 0x10;
    local_e0 = local_e0 + 0x10;
  }
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  TPZVec<std::complex<double>_>::~TPZVec(&diag);
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt()
{
    
    if( this->fDecomposed == ELDLt) return 1;
    if (  this->fDecomposed )
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt()");
#endif
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TPZVec<TVar> diag(dimension);
    for(j=0; j<dimension; j++)
    {
        diag[j] = *fElem[j];
    }
    
    //std::cout << "TPZSkylMatrix<TVar>::Decompose_LDLt: dimension = " << dimension  << std::endl;
    
    TVar sum;
    j = 1;
    while(j < dimension) {
        /*    if(!(j%100) && Dim() > 100) {
         cout <<  j << ' ';
         cout.flush();
         }
         if(!(j%1000)) cout << endl;*/
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            TVar *diagptr = &diag[k];
            sum = 0.;
            while(k < l) {
                //		  sum += *elj-- * *ell-- * *(fElem[k++]);
                //EBORIN: trocar *diagptr++ por *diagptr-- ajuda na vetorização?
                if constexpr(is_complex<TVar>::value){
                    sum += (*elj--) * std::conj(*ell--) * (*diagptr++);
                }else{
                    sum += (*elj--) * (*ell--) * (*diagptr++);
                }
                k++;
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
#ifdef PZ_LOG
                std::stringstream sout;
                sout << "col = " << j << " diagonal " << *elj;
                LOGPZ_DEBUG(logger,sout.str())
#endif
                
                *diagptr = *elj;
                cout << "TPZSkylMatrix pivot = " << *elj << endl;
                cout << "TPZSkylMatrix::DecomposeLDLt zero pivot\n";
                cout << "j = " << j << " l = " << l << endl;
            }
            else
            {
                *diagptr = *elj;
            }
            l++;
        }
        j++;
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}